

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O2

void RigidBodyDynamics::CalcConstrainedSystemVariables
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,ConstraintSet *CS,
               bool update_kinematics,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  long *plVar1;
  Constraint *this;
  undefined7 in_register_00000089;
  uint uVar2;
  long lVar3;
  Vector3d gamma_i;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_58 [8];
  undefined8 local_50;
  Vector3d prev_body_point;
  
  if ((int)CONCAT71(in_register_00000089,update_kinematics) != 0) {
    UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  }
  NonlinearEffects(model,Q,QDot,(VectorNd *)(CS + 0x178),f_ext);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(CS + 0x160));
  uVar2 = 0;
  CompositeRigidBodyAlgorithm(model,Q,(MatrixNd *)(CS + 0x160),false);
  CalcConstraintsJacobian(model,Q,CS,(MatrixNd *)(CS + 0x198),false);
  CalcConstraintsPositionError(model,Q,CS,(VectorNd *)(CS + 0x110),false);
  CalcConstraintsVelocityError(model,Q,QDot,CS,(VectorNd *)(CS + 0x120),false);
  gamma_i.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&prev_body_point,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&gamma_i);
  local_50 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&gamma_i,local_58);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(CS + 0x528));
  UpdateKinematicsCustom(model,(VectorNd *)0x0,(VectorNd *)0x0,(VectorNd *)(CS + 0x528));
  while( true ) {
    if ((ulong)(*(long *)(CS + 0xd0) - *(long *)(CS + 200) >> 4) <= (ulong)uVar2) break;
    lVar3 = (ulong)uVar2 * 0x10;
    plVar1 = *(long **)(*(long *)(CS + 200) + lVar3);
    (**(code **)(*plVar1 + 0x10))(0,plVar1,model,Q,QDot,CS + 0x198,CS + 0x188,CS + 0x620,0);
    this = *(Constraint **)(*(long *)(CS + 200) + lVar3);
    if (this->baumgarteEnabled == true) {
      Constraint::addInBaumgarteStabilizationForces
                (this,(VectorNd *)(CS + 0x110),(VectorNd *)(CS + 0x120),(VectorNd *)(CS + 0x188));
    }
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

RBDL_DLLAPI
void CalcConstrainedSystemVariables (
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  const Math::VectorNd &Tau,
  ConstraintSet &CS,
  bool update_kinematics,
  std::vector<Math::SpatialVector> *f_ext
)
{
  // Compute G
  if(update_kinematics){
    UpdateKinematicsCustom(model, &Q, NULL, NULL);
  }

  // Compute C
  NonlinearEffects(model, Q, QDot, CS.C, f_ext);
  assert(CS.H.cols() == model.dof_count && CS.H.rows() == model.dof_count);

  // Compute H
  CS.H.setZero();
  CompositeRigidBodyAlgorithm(model, Q, CS.H, false);

  CalcConstraintsJacobian (model, Q, CS, CS.G, false);

  // Compute position error for Baumgarte Stabilization.
  CalcConstraintsPositionError (model, Q, CS, CS.err, false);

  // Compute velocity error for Baugarte stabilization.
  CalcConstraintsVelocityError (model, Q, QDot, CS, CS.errd, false);
  //CS.errd = CS.G * QDot;

  // Compute gamma
  unsigned int prev_body_id = 0;
  Vector3d prev_body_point = Vector3d::Zero();
  Vector3d gamma_i = Vector3d::Zero();

  CS.QDDot_0.setZero();
  UpdateKinematicsCustom(model, NULL, NULL, &CS.QDDot_0);


  for(unsigned int i=0; i<CS.constraints.size(); ++i) {
    CS.constraints[i]->calcGamma(model,0,Q,QDot,CS.G,CS.gamma,CS.cache);
    if(CS.constraints[i]->isBaumgarteStabilizationEnabled()) {
      CS.constraints[i]->addInBaumgarteStabilizationForces(
        CS.err,CS.errd,CS.gamma);
    }
  }


}